

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  U32 UVar4;
  undefined8 uVar5;
  seqDef *psVar6;
  seqDef *psVar7;
  seqDef *psVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  int iVar10;
  size_t sVar11;
  uint uVar12;
  U32 UVar13;
  uint offset;
  U32 UVar14;
  size_t err_code;
  ulong uVar15;
  BYTE *op;
  uint offset_00;
  bool bVar16;
  undefined1 auVar17 [16];
  repcodes_t rVar18;
  undefined8 in_stack_ffffffffffffff90;
  repcodes_t dRepOriginal;
  
  iVar10 = (int)in_stack_ffffffffffffff90;
  UVar4 = dRep->rep[2];
  uVar5 = *(undefined8 *)dRep->rep;
  if (isPartition != 0) {
    psVar6 = seqStore->sequences;
    psVar7 = seqStore->sequencesStart;
    for (uVar15 = 0; iVar10 = (int)in_stack_ffffffffffffff90,
        ((ulong)((long)psVar6 - (long)psVar7) >> 3 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
      psVar8 = seqStore->sequencesStart;
      bVar16 = psVar8[uVar15].litLength == 0;
      offset_00 = psVar8[uVar15].offset - 1;
      offset = offset_00;
      if (offset_00 < 3) {
        uVar12 = bVar16 + offset_00;
        if (uVar12 == 3) {
          UVar14 = dRep->rep[0] - 1;
          UVar13 = cRep->rep[0] - 1;
        }
        else {
          UVar14 = dRep->rep[uVar12];
          UVar13 = cRep->rep[uVar12];
        }
        if (UVar14 != UVar13) {
          psVar8[uVar15].offset = UVar13 + 3;
          offset = UVar13 + 2;
        }
      }
      uVar12 = (uint)bVar16;
      rVar18 = ZSTD_updateRep(dRep->rep,offset,uVar12);
      *(repcodes_t *)dRep->rep = rVar18;
      in_stack_ffffffffffffff90 = 0x4e18c8;
      rVar18 = ZSTD_updateRep(cRep->rep,offset_00,uVar12);
      *(repcodes_t *)cRep->rep = rVar18;
    }
  }
  sVar11 = ZSTD_entropyCompressSeqStore
                     (seqStore,&((zc->blockState).prevCBlock)->entropy,
                      &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                      (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                      (ulong)(uint)zc->bmi2,iVar10);
  if (sVar11 < 0xffffffffffffff89) {
    if ((sVar11 < 0x19) && (zc->isFirstBlock == 0)) {
      iVar10 = ZSTD_isRLE((BYTE *)src,srcSize);
      if (iVar10 != 0) {
        sVar11 = 1;
      }
    }
    if ((zc->seqCollector).collectSequences == 0) {
      pZVar9 = (zc->blockState).prevCBlock;
      if ((pZVar9->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (pZVar9->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      if (sVar11 == 1) {
        if (3 < dstCapacity) {
          uVar3 = *src;
          iVar10 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar10;
          *(char *)((long)dst + 2) = (char)((uint)iVar10 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar3;
          dRep->rep[2] = UVar4;
          *(undefined8 *)dRep->rep = uVar5;
          return 4;
        }
      }
      else {
        if (sVar11 != 0) {
          (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
          (zc->blockState).nextCBlock = pZVar9;
          iVar10 = lastBlock + (int)sVar11 * 8 + 4;
          *(short *)dst = (short)iVar10;
          *(char *)((long)dst + 2) = (char)((uint)iVar10 >> 0x10);
          return sVar11 + 3;
        }
        uVar15 = srcSize + 3;
        if (uVar15 <= dstCapacity) {
          iVar10 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar10;
          *(char *)((long)dst + 2) = (char)((uint)iVar10 >> 0x10);
          memcpy((void *)((long)dst + 3),src,srcSize);
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
          dRep->rep[2] = UVar4;
          *(undefined8 *)dRep->rep = uVar5;
          return uVar15;
        }
      }
      sVar11 = 0xffffffffffffffba;
    }
    else {
      ZSTD_copyBlockSequences(zc);
      uVar1 = (zc->blockState).prevCBlock;
      uVar2 = (zc->blockState).nextCBlock;
      auVar17._8_4_ = (int)uVar1;
      auVar17._0_8_ = uVar2;
      auVar17._12_4_ = (int)((ulong)uVar1 >> 0x20);
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar2;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar17._8_8_;
      sVar11 = 0;
    }
  }
  return sVar11;
}

Assistant:

static size_t ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc, seqStore_t* const seqStore,
                                                repcodes_t* const dRep, repcodes_t* const cRep,
                                                void* dst, size_t dstCapacity,
                                                const void* src, size_t srcSize,
                                                U32 lastBlock, U32 isPartition) {
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }
    return cSize;
}